

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O3

void init_builtins(Context_conflict *ctx)

{
  Context_conflict *pCVar1;
  uint uVar2;
  uint len;
  int iVar3;
  MOJOSHADER_astDataType *pMVar4;
  char *pcVar5;
  long lVar6;
  char *pcVar7;
  MOJOSHADER_astDataType *pMVar8;
  MOJOSHADER_astDataType *pMVar9;
  uint columns;
  MOJOSHADER_astDataType *dt_2;
  char buf [32];
  MOJOSHADER_astDataType *dt;
  MOJOSHADER_astDataType *dt_1;
  anon_struct_16_2_7e7b00ca types [6];
  MOJOSHADER_astDataType *local_108;
  MOJOSHADER_astDataType *local_100;
  MOJOSHADER_astDataType *local_f8;
  Context_conflict *local_e0;
  MOJOSHADER_astDataType *local_d8;
  MOJOSHADER_astDataType *local_d0;
  MOJOSHADER_astDataType *local_c8;
  MOJOSHADER_astDataType *local_c0;
  MOJOSHADER_astDataType *local_b8;
  MOJOSHADER_astDataType *local_b0;
  long local_a8;
  char **local_a0;
  char *local_98;
  MOJOSHADER_astDataType *local_90;
  char *local_88;
  MOJOSHADER_astDataType *local_80;
  char *local_78;
  MOJOSHADER_astDataType *local_70;
  char *local_68;
  MOJOSHADER_astDataType *local_60;
  char *local_58;
  MOJOSHADER_astDataType *local_50;
  char *local_48;
  MOJOSHADER_astDataType *local_40;
  
  local_98 = "bool";
  local_90 = &ctx->dt_bool;
  local_88 = "int";
  local_d0 = &ctx->dt_int;
  local_80 = local_d0;
  local_78 = "uint";
  local_d8 = &ctx->dt_uint;
  local_70 = local_d8;
  local_68 = "half";
  local_c0 = &ctx->dt_half;
  local_60 = local_c0;
  local_58 = "float";
  local_b0 = &ctx->dt_float;
  local_50 = local_b0;
  local_48 = "double";
  local_c8 = &ctx->dt_double;
  local_40 = local_c8;
  lVar6 = 0;
  local_e0 = ctx;
  do {
    local_a0 = &local_98 + lVar6 * 2;
    local_b8 = (&local_90)[lVar6 * 2];
    columns = 1;
    local_a8 = lVar6;
    do {
      pMVar4 = new_datatype_vector(ctx,local_b8,columns);
      pcVar7 = *local_a0;
      uVar2 = snprintf((char *)&local_108,0x20,"%s%d",pcVar7,(ulong)columns);
      pcVar5 = stringcache_len(ctx->strcache,(char *)&local_108,uVar2);
      push_usertype(ctx,pcVar5,pMVar4);
      uVar2 = 1;
      do {
        pMVar4 = new_datatype_matrix(ctx,local_b8,columns,uVar2);
        len = snprintf((char *)&local_108,0x20,"%s%dx%d",pcVar7,(ulong)columns,(ulong)uVar2);
        pcVar5 = stringcache_len(ctx->strcache,(char *)&local_108,len);
        push_usertype(ctx,pcVar5,pMVar4);
        pCVar1 = local_e0;
        uVar2 = uVar2 + 1;
      } while (uVar2 != 5);
      columns = columns + 1;
    } while (columns != 5);
    lVar6 = local_a8 + 1;
  } while (lVar6 != 6);
  pcVar7 = stringcache(local_e0->strcache,"abs");
  local_108 = local_d8;
  pMVar8 = build_function_datatype(pCVar1,local_d8,1,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"uint1",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,1,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"uint2",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,1,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"uint3",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,1,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"uint4",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,1,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"uint1x1",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,1,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"uint1x2",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,1,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"uint1x3",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,1,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"uint1x4",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,1,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"uint2x1",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,1,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"uint2x2",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,1,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"uint2x3",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,1,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"uint2x4",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,1,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"uint3x1",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,1,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"uint3x2",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,1,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"uint3x3",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,1,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"uint3x4",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,1,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"uint4x1",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,1,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"uint4x2",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,1,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"uint4x3",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,1,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"uint4x4",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,1,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  local_108 = local_d0;
  pMVar8 = build_function_datatype(pCVar1,local_d0,1,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"int1",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,1,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"int2",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,1,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"int3",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,1,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"int4",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,1,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"int1x1",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,1,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"int1x2",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,1,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"int1x3",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,1,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"int1x4",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,1,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"int2x1",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,1,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"int2x2",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,1,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"int2x3",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,1,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"int2x4",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,1,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"int3x1",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,1,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"int3x2",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,1,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"int3x3",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,1,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"int3x4",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,1,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"int4x1",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,1,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"int4x2",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,1,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"int4x3",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,1,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"int4x4",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,1,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  add_intrinsic_SAME1_ANYf(pCVar1,pcVar7);
  pcVar7 = stringcache(pCVar1->strcache,"acos");
  add_intrinsic_SAME1_ANYf(pCVar1,pcVar7);
  pcVar7 = stringcache(pCVar1->strcache,"all");
  add_intrinsic_BOOL_ANYfib(pCVar1,pcVar7);
  pcVar7 = stringcache(pCVar1->strcache,"any");
  add_intrinsic_BOOL_ANYfib(pCVar1,pcVar7);
  pcVar7 = stringcache(pCVar1->strcache,"asin");
  add_intrinsic_SAME1_ANYf(pCVar1,pcVar7);
  pcVar7 = stringcache(pCVar1->strcache,"atan");
  add_intrinsic_SAME1_ANYf(pCVar1,pcVar7);
  pcVar7 = stringcache(pCVar1->strcache,"atan2");
  add_intrinsic_SAME1_ANYf_SAME1(pCVar1,pcVar7);
  pcVar7 = stringcache(pCVar1->strcache,"ceil");
  add_intrinsic_SAME1_ANYf(pCVar1,pcVar7);
  pcVar7 = stringcache(pCVar1->strcache,"clamp");
  local_108 = local_d8;
  local_100 = local_d8;
  local_f8 = local_d8;
  pMVar8 = build_function_datatype(pCVar1,local_d8,3,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"uint1",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,3,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"uint2",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,3,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"uint3",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,3,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"uint4",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,3,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"uint1x1",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,3,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"uint1x2",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,3,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"uint1x3",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,3,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"uint1x4",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,3,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"uint2x1",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,3,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"uint2x2",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,3,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"uint2x3",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,3,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"uint2x4",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,3,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"uint3x1",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,3,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"uint3x2",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,3,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"uint3x3",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,3,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"uint3x4",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,3,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"uint4x1",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,3,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"uint4x2",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,3,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"uint4x3",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,3,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"uint4x4",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,3,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  local_108 = local_d0;
  local_100 = local_d0;
  local_f8 = local_d0;
  pMVar8 = build_function_datatype(pCVar1,local_d0,3,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"int1",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,3,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"int2",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,3,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"int3",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,3,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"int4",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,3,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"int1x1",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,3,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"int1x2",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,3,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"int1x3",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,3,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"int1x4",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,3,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"int2x1",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,3,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"int2x2",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,3,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"int2x3",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,3,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"int2x4",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,3,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"int3x1",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,3,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"int3x2",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,3,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"int3x3",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,3,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"int3x4",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,3,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"int4x1",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,3,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"int4x2",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,3,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"int4x3",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,3,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"int4x4",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,3,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  add_intrinsic_SAME1_ANYf_SAME1_SAME1(pCVar1,pcVar7);
  pcVar7 = stringcache(pCVar1->strcache,"clip");
  local_108 = local_c8;
  pMVar8 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,1,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar8,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"double1",&local_108);
  pMVar8 = local_b0;
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  pMVar9 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar4;
  pMVar4 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,1,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar4,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"double2",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar9 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar9 = (local_108->array).base;
    }
  }
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar9;
  pMVar9 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,1,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"double3",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  pMVar9 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar4;
  pMVar4 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,1,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar4,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"double4",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar9 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar9 = (local_108->array).base;
    }
  }
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar9;
  pMVar9 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,1,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"double1x1",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  pMVar9 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar4;
  pMVar4 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,1,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar4,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"double1x2",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar9 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar9 = (local_108->array).base;
    }
  }
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar9;
  pMVar9 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,1,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"double1x3",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  pMVar9 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar4;
  pMVar4 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,1,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar4,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"double1x4",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar9 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar9 = (local_108->array).base;
    }
  }
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar9;
  pMVar9 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,1,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"double2x1",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  pMVar9 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar4;
  pMVar4 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,1,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar4,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"double2x2",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar9 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar9 = (local_108->array).base;
    }
  }
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar9;
  pMVar9 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,1,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"double2x3",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  pMVar9 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar4;
  pMVar4 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,1,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar4,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"double2x4",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar9 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar9 = (local_108->array).base;
    }
  }
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar9;
  pMVar9 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,1,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"double3x1",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  pMVar9 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar4;
  pMVar4 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,1,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar4,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"double3x2",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar9 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar9 = (local_108->array).base;
    }
  }
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar9;
  pMVar9 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,1,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"double3x3",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  pMVar9 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar4;
  pMVar4 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,1,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar4,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"double3x4",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar9 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar9 = (local_108->array).base;
    }
  }
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar9;
  pMVar9 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,1,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"double4x1",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  pMVar9 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar4;
  pMVar4 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,1,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar4,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"double4x2",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar9 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar9 = (local_108->array).base;
    }
  }
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar9;
  pMVar9 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,1,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"double4x3",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  pMVar9 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar4;
  pMVar4 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,1,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar4,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"double4x4",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar9 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar9 = (local_108->array).base;
    }
  }
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar9;
  pMVar9 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,1,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar9,0);
  local_108 = local_c0;
  pMVar9 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,1,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"half1",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  pMVar9 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar4;
  pMVar4 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,1,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar4,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"half2",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar9 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar9 = (local_108->array).base;
    }
  }
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar9;
  pMVar9 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,1,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"half3",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  pMVar9 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar4;
  pMVar4 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,1,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar4,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"half4",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar9 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar9 = (local_108->array).base;
    }
  }
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar9;
  pMVar9 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,1,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"half1x1",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  pMVar9 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar4;
  pMVar4 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,1,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar4,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"half1x2",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar9 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar9 = (local_108->array).base;
    }
  }
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar9;
  pMVar9 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,1,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"half1x3",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  pMVar9 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar4;
  pMVar4 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,1,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar4,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"half1x4",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar9 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar9 = (local_108->array).base;
    }
  }
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar9;
  pMVar9 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,1,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"half2x1",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  pMVar9 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar4;
  pMVar4 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,1,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar4,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"half2x2",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar9 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar9 = (local_108->array).base;
    }
  }
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar9;
  pMVar9 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,1,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"half2x3",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  pMVar9 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar4;
  pMVar4 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,1,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar4,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"half2x4",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar9 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar9 = (local_108->array).base;
    }
  }
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar9;
  pMVar9 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,1,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"half3x1",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  pMVar9 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar4;
  pMVar4 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,1,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar4,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"half3x2",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar9 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar9 = (local_108->array).base;
    }
  }
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar9;
  pMVar9 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,1,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"half3x3",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  pMVar9 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar4;
  pMVar4 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,1,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar4,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"half3x4",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar9 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar9 = (local_108->array).base;
    }
  }
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar9;
  pMVar9 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,1,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"half4x1",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  pMVar9 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar4;
  pMVar4 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,1,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar4,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"half4x2",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar9 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar9 = (local_108->array).base;
    }
  }
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar9;
  pMVar9 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,1,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"half4x3",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  pMVar9 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar4;
  pMVar4 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,1,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar4,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"half4x4",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar9 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar9 = (local_108->array).base;
    }
  }
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar9;
  pMVar9 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,1,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar9,0);
  local_108 = pMVar8;
  pMVar9 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,1,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"float1",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  pMVar9 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar4;
  pMVar4 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,1,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar4,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"float2",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar9 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar9 = (local_108->array).base;
    }
  }
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar9;
  pMVar9 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,1,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"float3",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  pMVar9 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar4;
  pMVar4 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,1,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar4,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"float4",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar9 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar9 = (local_108->array).base;
    }
  }
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar9;
  pMVar9 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,1,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"float1x1",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  pMVar9 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar4;
  pMVar4 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,1,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar4,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"float1x2",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar9 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar9 = (local_108->array).base;
    }
  }
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar9;
  pMVar9 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,1,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"float1x3",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  pMVar9 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar4;
  pMVar4 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,1,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar4,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"float1x4",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar9 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar9 = (local_108->array).base;
    }
  }
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar9;
  pMVar9 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,1,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"float2x1",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  pMVar9 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar4;
  pMVar4 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,1,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar4,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"float2x2",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar9 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar9 = (local_108->array).base;
    }
  }
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar9;
  pMVar9 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,1,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"float2x3",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  pMVar9 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar4;
  pMVar4 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,1,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar4,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"float2x4",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar9 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar9 = (local_108->array).base;
    }
  }
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar9;
  pMVar9 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,1,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"float3x1",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  pMVar9 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar4;
  pMVar4 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,1,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar4,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"float3x2",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar9 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar9 = (local_108->array).base;
    }
  }
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar9;
  pMVar9 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,1,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"float3x3",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  pMVar9 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar4;
  pMVar4 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,1,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar4,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"float3x4",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar9 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar9 = (local_108->array).base;
    }
  }
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar9;
  pMVar9 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,1,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"float4x1",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  pMVar9 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar4;
  pMVar4 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,1,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar4,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"float4x2",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar9 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar9 = (local_108->array).base;
    }
  }
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar9;
  pMVar9 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,1,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"float4x3",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  pMVar9 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar4;
  pMVar4 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,1,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar4,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"float4x4",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar9 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar9 = (local_108->array).base;
    }
  }
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar9;
  pMVar9 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,1,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar9,0);
  pcVar7 = stringcache(pCVar1->strcache,"cos");
  add_intrinsic_SAME1_ANYf(pCVar1,pcVar7);
  pcVar7 = stringcache(pCVar1->strcache,"cosh");
  add_intrinsic_SAME1_ANYf(pCVar1,pcVar7);
  pcVar7 = stringcache(pCVar1->strcache,"cross");
  iVar3 = hash_find((pCVar1->usertypes).hash,"float3",&local_108);
  pCVar1 = local_e0;
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  pMVar9 = build_function_datatype(local_e0,pMVar4,2,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  pcVar7 = stringcache(pCVar1->strcache,"D3DCOLORtoUBYTE4");
  iVar3 = hash_find((pCVar1->usertypes).hash,"int4",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  iVar3 = hash_find((pCVar1->usertypes).hash,"float4",&local_108);
  if ((iVar3 == 0) || (local_108 == (MOJOSHADER_astDataType *)0x0)) {
    local_108 = (MOJOSHADER_astDataType *)0x0;
  }
  else {
    local_108 = (local_108->array).base;
  }
  pMVar9 = build_function_datatype(pCVar1,pMVar4,1,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  pcVar7 = stringcache(pCVar1->strcache,"distance");
  iVar3 = hash_find((pCVar1->usertypes).hash,"float1",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (MOJOSHADER_astDataType *)(local_108->structure).members;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  pMVar9 = build_function_datatype
                     (pCVar1,(MOJOSHADER_astDataType *)((pMVar4->structure).members)->identifier,2,
                      &local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"float2",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (MOJOSHADER_astDataType *)(local_108->structure).members;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  pMVar9 = build_function_datatype
                     (pCVar1,(MOJOSHADER_astDataType *)((pMVar4->structure).members)->identifier,2,
                      &local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"float3",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (MOJOSHADER_astDataType *)(local_108->structure).members;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  pMVar9 = build_function_datatype
                     (pCVar1,(MOJOSHADER_astDataType *)((pMVar4->structure).members)->identifier,2,
                      &local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"float4",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (MOJOSHADER_astDataType *)(local_108->structure).members;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  pMVar9 = build_function_datatype
                     (pCVar1,(MOJOSHADER_astDataType *)((pMVar4->structure).members)->identifier,2,
                      &local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"half1",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (MOJOSHADER_astDataType *)(local_108->structure).members;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  pMVar9 = build_function_datatype
                     (pCVar1,(MOJOSHADER_astDataType *)((pMVar4->structure).members)->identifier,2,
                      &local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"half2",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (MOJOSHADER_astDataType *)(local_108->structure).members;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  pMVar9 = build_function_datatype
                     (pCVar1,(MOJOSHADER_astDataType *)((pMVar4->structure).members)->identifier,2,
                      &local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"half3",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (MOJOSHADER_astDataType *)(local_108->structure).members;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  pMVar9 = build_function_datatype
                     (pCVar1,(MOJOSHADER_astDataType *)((pMVar4->structure).members)->identifier,2,
                      &local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"half4",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (MOJOSHADER_astDataType *)(local_108->structure).members;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  pMVar9 = build_function_datatype
                     (pCVar1,(MOJOSHADER_astDataType *)((pMVar4->structure).members)->identifier,2,
                      &local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"double1",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (MOJOSHADER_astDataType *)(local_108->structure).members;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  pMVar9 = build_function_datatype
                     (pCVar1,(MOJOSHADER_astDataType *)((pMVar4->structure).members)->identifier,2,
                      &local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"double2",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (MOJOSHADER_astDataType *)(local_108->structure).members;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  pMVar9 = build_function_datatype
                     (pCVar1,(MOJOSHADER_astDataType *)((pMVar4->structure).members)->identifier,2,
                      &local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"double3",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (MOJOSHADER_astDataType *)(local_108->structure).members;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  pMVar9 = build_function_datatype
                     (pCVar1,(MOJOSHADER_astDataType *)((pMVar4->structure).members)->identifier,2,
                      &local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"double4",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (MOJOSHADER_astDataType *)(local_108->structure).members;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  pMVar9 = build_function_datatype
                     (pCVar1,(MOJOSHADER_astDataType *)((pMVar4->structure).members)->identifier,2,
                      &local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  pcVar7 = stringcache(pCVar1->strcache,"degrees");
  add_intrinsic_SAME1_ANYf(pCVar1,pcVar7);
  pcVar7 = stringcache(pCVar1->strcache,"determinant");
  iVar3 = hash_find((pCVar1->usertypes).hash,"float1x1",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  pMVar9 = build_function_datatype(pCVar1,pMVar8,1,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"float2x2",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  pMVar9 = build_function_datatype(pCVar1,pMVar8,1,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"float3x3",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  pMVar9 = build_function_datatype(pCVar1,pMVar8,1,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"float4x4",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  pMVar9 = build_function_datatype(pCVar1,pMVar8,1,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  pcVar7 = stringcache(pCVar1->strcache,"dot");
  iVar3 = hash_find((pCVar1->usertypes).hash,"int1",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (MOJOSHADER_astDataType *)(local_108->structure).members;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  pMVar9 = build_function_datatype
                     (pCVar1,(MOJOSHADER_astDataType *)((pMVar4->structure).members)->identifier,2,
                      &local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"int2",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (MOJOSHADER_astDataType *)(local_108->structure).members;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  pMVar9 = build_function_datatype
                     (pCVar1,(MOJOSHADER_astDataType *)((pMVar4->structure).members)->identifier,2,
                      &local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"int3",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (MOJOSHADER_astDataType *)(local_108->structure).members;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  pMVar9 = build_function_datatype
                     (pCVar1,(MOJOSHADER_astDataType *)((pMVar4->structure).members)->identifier,2,
                      &local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"int4",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (MOJOSHADER_astDataType *)(local_108->structure).members;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  pMVar9 = build_function_datatype
                     (pCVar1,(MOJOSHADER_astDataType *)((pMVar4->structure).members)->identifier,2,
                      &local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"uint1",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (MOJOSHADER_astDataType *)(local_108->structure).members;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  pMVar9 = build_function_datatype
                     (pCVar1,(MOJOSHADER_astDataType *)((pMVar4->structure).members)->identifier,2,
                      &local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"uint2",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (MOJOSHADER_astDataType *)(local_108->structure).members;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  pMVar9 = build_function_datatype
                     (pCVar1,(MOJOSHADER_astDataType *)((pMVar4->structure).members)->identifier,2,
                      &local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"uint3",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (MOJOSHADER_astDataType *)(local_108->structure).members;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  pMVar9 = build_function_datatype
                     (pCVar1,(MOJOSHADER_astDataType *)((pMVar4->structure).members)->identifier,2,
                      &local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"uint4",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (MOJOSHADER_astDataType *)(local_108->structure).members;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  pMVar9 = build_function_datatype
                     (pCVar1,(MOJOSHADER_astDataType *)((pMVar4->structure).members)->identifier,2,
                      &local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"float1",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (MOJOSHADER_astDataType *)(local_108->structure).members;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  pMVar9 = build_function_datatype
                     (pCVar1,(MOJOSHADER_astDataType *)((pMVar4->structure).members)->identifier,2,
                      &local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"float2",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (MOJOSHADER_astDataType *)(local_108->structure).members;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  pMVar9 = build_function_datatype
                     (pCVar1,(MOJOSHADER_astDataType *)((pMVar4->structure).members)->identifier,2,
                      &local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"float3",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (MOJOSHADER_astDataType *)(local_108->structure).members;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  pMVar9 = build_function_datatype
                     (pCVar1,(MOJOSHADER_astDataType *)((pMVar4->structure).members)->identifier,2,
                      &local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"float4",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (MOJOSHADER_astDataType *)(local_108->structure).members;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  pMVar9 = build_function_datatype
                     (pCVar1,(MOJOSHADER_astDataType *)((pMVar4->structure).members)->identifier,2,
                      &local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"half1",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (MOJOSHADER_astDataType *)(local_108->structure).members;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  pMVar9 = build_function_datatype
                     (pCVar1,(MOJOSHADER_astDataType *)((pMVar4->structure).members)->identifier,2,
                      &local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"half2",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (MOJOSHADER_astDataType *)(local_108->structure).members;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  pMVar9 = build_function_datatype
                     (pCVar1,(MOJOSHADER_astDataType *)((pMVar4->structure).members)->identifier,2,
                      &local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"half3",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (MOJOSHADER_astDataType *)(local_108->structure).members;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  pMVar9 = build_function_datatype
                     (pCVar1,(MOJOSHADER_astDataType *)((pMVar4->structure).members)->identifier,2,
                      &local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"half4",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (MOJOSHADER_astDataType *)(local_108->structure).members;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  pMVar9 = build_function_datatype
                     (pCVar1,(MOJOSHADER_astDataType *)((pMVar4->structure).members)->identifier,2,
                      &local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"double1",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (MOJOSHADER_astDataType *)(local_108->structure).members;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  pMVar9 = build_function_datatype
                     (pCVar1,(MOJOSHADER_astDataType *)((pMVar4->structure).members)->identifier,2,
                      &local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"double2",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (MOJOSHADER_astDataType *)(local_108->structure).members;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  pMVar9 = build_function_datatype
                     (pCVar1,(MOJOSHADER_astDataType *)((pMVar4->structure).members)->identifier,2,
                      &local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"double3",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (MOJOSHADER_astDataType *)(local_108->structure).members;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  pMVar9 = build_function_datatype
                     (pCVar1,(MOJOSHADER_astDataType *)((pMVar4->structure).members)->identifier,2,
                      &local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"double4",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (MOJOSHADER_astDataType *)(local_108->structure).members;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  pMVar9 = build_function_datatype
                     (pCVar1,(MOJOSHADER_astDataType *)((pMVar4->structure).members)->identifier,2,
                      &local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  pcVar7 = stringcache(pCVar1->strcache,"exp");
  add_intrinsic_SAME1_ANYf(pCVar1,pcVar7);
  pcVar7 = stringcache(pCVar1->strcache,"exp2");
  add_intrinsic_SAME1_ANYf(pCVar1,pcVar7);
  pcVar7 = stringcache(pCVar1->strcache,"faceforward");
  iVar3 = hash_find((pCVar1->usertypes).hash,"float1",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar9 = build_function_datatype(pCVar1,pMVar4,3,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"float2",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar9 = build_function_datatype(pCVar1,pMVar4,3,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"float3",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar9 = build_function_datatype(pCVar1,pMVar4,3,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"float4",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar9 = build_function_datatype(pCVar1,pMVar4,3,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"half1",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar9 = build_function_datatype(pCVar1,pMVar4,3,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"half2",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar9 = build_function_datatype(pCVar1,pMVar4,3,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"half3",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar9 = build_function_datatype(pCVar1,pMVar4,3,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"half4",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar9 = build_function_datatype(pCVar1,pMVar4,3,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"double1",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar9 = build_function_datatype(pCVar1,pMVar4,3,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"double2",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar9 = build_function_datatype(pCVar1,pMVar4,3,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"double3",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar9 = build_function_datatype(pCVar1,pMVar4,3,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"double4",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar9 = build_function_datatype(pCVar1,pMVar4,3,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  pcVar7 = stringcache(pCVar1->strcache,"floor");
  add_intrinsic_SAME1_ANYf(pCVar1,pcVar7);
  pcVar7 = stringcache(pCVar1->strcache,"fmod");
  add_intrinsic_SAME1_ANYf_SAME1(pCVar1,pcVar7);
  pcVar7 = stringcache(pCVar1->strcache,"frac");
  add_intrinsic_SAME1_ANYf(pCVar1,pcVar7);
  pcVar7 = stringcache(pCVar1->strcache,"isfinite");
  add_intrinsic_BOOL_ANYf(pCVar1,pcVar7);
  pcVar7 = stringcache(pCVar1->strcache,"isinf");
  add_intrinsic_BOOL_ANYf(pCVar1,pcVar7);
  pcVar7 = stringcache(pCVar1->strcache,"isnan");
  add_intrinsic_BOOL_ANYf(pCVar1,pcVar7);
  pcVar7 = stringcache(pCVar1->strcache,"ldexp");
  add_intrinsic_SAME1_ANYf_SAME1(pCVar1,pcVar7);
  pcVar7 = stringcache(pCVar1->strcache,"length");
  add_intrinsic_f_Vf(pCVar1,pcVar7);
  pcVar7 = stringcache(pCVar1->strcache,"lerp");
  add_intrinsic_SAME1_ANYf_SAME1_SAME1(pCVar1,pcVar7);
  pcVar7 = stringcache(pCVar1->strcache,"lit");
  iVar3 = hash_find((pCVar1->usertypes).hash,"float4",&local_108);
  pCVar1 = local_e0;
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar8;
  local_100 = pMVar8;
  local_f8 = pMVar8;
  pMVar9 = build_function_datatype(local_e0,pMVar4,3,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  pcVar7 = stringcache(pCVar1->strcache,"log");
  add_intrinsic_SAME1_ANYf(pCVar1,pcVar7);
  pcVar7 = stringcache(pCVar1->strcache,"log10");
  add_intrinsic_SAME1_ANYf(pCVar1,pcVar7);
  pcVar7 = stringcache(pCVar1->strcache,"log2");
  add_intrinsic_SAME1_ANYf(pCVar1,pcVar7);
  pcVar7 = stringcache(pCVar1->strcache,"max");
  add_intrinsic_SAME1_ANYfi_SAME1(pCVar1,pcVar7);
  pcVar7 = stringcache(pCVar1->strcache,"min");
  add_intrinsic_SAME1_ANYfi_SAME1(pCVar1,pcVar7);
  pcVar7 = stringcache(pCVar1->strcache,"modf");
  add_intrinsic_SAME1_ANYfi_SAME1(pCVar1,pcVar7);
  pcVar7 = stringcache(pCVar1->strcache,"mul");
  add_intrinsic_mul(pCVar1,pcVar7);
  pcVar7 = stringcache(pCVar1->strcache,"noise");
  add_intrinsic_f_Vf(pCVar1,pcVar7);
  pcVar7 = stringcache(pCVar1->strcache,"normalize");
  iVar3 = hash_find((pCVar1->usertypes).hash,"float1",&local_108);
  pCVar1 = local_e0;
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  pMVar9 = build_function_datatype(local_e0,pMVar4,1,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"float2",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  pMVar9 = build_function_datatype(pCVar1,pMVar4,1,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"float3",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  pMVar9 = build_function_datatype(pCVar1,pMVar4,1,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"float4",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  pMVar9 = build_function_datatype(pCVar1,pMVar4,1,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"half1",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  pMVar9 = build_function_datatype(pCVar1,pMVar4,1,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"half2",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  pMVar9 = build_function_datatype(pCVar1,pMVar4,1,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"half3",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  pMVar9 = build_function_datatype(pCVar1,pMVar4,1,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"half4",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  pMVar9 = build_function_datatype(pCVar1,pMVar4,1,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"double1",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  pMVar9 = build_function_datatype(pCVar1,pMVar4,1,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"double2",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  pMVar9 = build_function_datatype(pCVar1,pMVar4,1,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"double3",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  pMVar9 = build_function_datatype(pCVar1,pMVar4,1,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"double4",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = pMVar4;
  pMVar9 = build_function_datatype(pCVar1,pMVar4,1,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  pcVar7 = stringcache(pCVar1->strcache,"pow");
  add_intrinsic_SAME1_ANYf_SAME1(pCVar1,pcVar7);
  pcVar7 = stringcache(pCVar1->strcache,"radians");
  add_intrinsic_SAME1_ANYf(pCVar1,pcVar7);
  pcVar7 = stringcache(pCVar1->strcache,"reflect");
  add_intrinsic_SAME1_ANYfi_SAME1(pCVar1,pcVar7);
  pcVar7 = stringcache(pCVar1->strcache,"refract");
  iVar3 = hash_find((pCVar1->usertypes).hash,"float1",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_f8 = (MOJOSHADER_astDataType *)((pMVar4->structure).members)->identifier;
  local_108 = pMVar4;
  local_100 = pMVar4;
  pMVar9 = build_function_datatype(pCVar1,pMVar4,3,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"float2",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_f8 = (MOJOSHADER_astDataType *)((pMVar4->structure).members)->identifier;
  local_108 = pMVar4;
  local_100 = pMVar4;
  pMVar9 = build_function_datatype(pCVar1,pMVar4,3,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"float3",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_f8 = (MOJOSHADER_astDataType *)((pMVar4->structure).members)->identifier;
  local_108 = pMVar4;
  local_100 = pMVar4;
  pMVar9 = build_function_datatype(pCVar1,pMVar4,3,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"float4",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_f8 = (MOJOSHADER_astDataType *)((pMVar4->structure).members)->identifier;
  local_108 = pMVar4;
  local_100 = pMVar4;
  pMVar9 = build_function_datatype(pCVar1,pMVar4,3,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"half1",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_f8 = (MOJOSHADER_astDataType *)((pMVar4->structure).members)->identifier;
  local_108 = pMVar4;
  local_100 = pMVar4;
  pMVar9 = build_function_datatype(pCVar1,pMVar4,3,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"half2",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_f8 = (MOJOSHADER_astDataType *)((pMVar4->structure).members)->identifier;
  local_108 = pMVar4;
  local_100 = pMVar4;
  pMVar9 = build_function_datatype(pCVar1,pMVar4,3,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"half3",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_f8 = (MOJOSHADER_astDataType *)((pMVar4->structure).members)->identifier;
  local_108 = pMVar4;
  local_100 = pMVar4;
  pMVar9 = build_function_datatype(pCVar1,pMVar4,3,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"half4",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_f8 = (MOJOSHADER_astDataType *)((pMVar4->structure).members)->identifier;
  local_108 = pMVar4;
  local_100 = pMVar4;
  pMVar9 = build_function_datatype(pCVar1,pMVar4,3,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"double1",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_f8 = (MOJOSHADER_astDataType *)((pMVar4->structure).members)->identifier;
  local_108 = pMVar4;
  local_100 = pMVar4;
  pMVar9 = build_function_datatype(pCVar1,pMVar4,3,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"double2",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_f8 = (MOJOSHADER_astDataType *)((pMVar4->structure).members)->identifier;
  local_108 = pMVar4;
  local_100 = pMVar4;
  pMVar9 = build_function_datatype(pCVar1,pMVar4,3,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"double3",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_f8 = (MOJOSHADER_astDataType *)((pMVar4->structure).members)->identifier;
  local_108 = pMVar4;
  local_100 = pMVar4;
  pMVar9 = build_function_datatype(pCVar1,pMVar4,3,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"double4",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_f8 = (MOJOSHADER_astDataType *)((pMVar4->structure).members)->identifier;
  local_108 = pMVar4;
  local_100 = pMVar4;
  pMVar9 = build_function_datatype(pCVar1,pMVar4,3,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar9,0);
  pcVar7 = stringcache(pCVar1->strcache,"round");
  add_intrinsic_SAME1_ANYf(pCVar1,pcVar7);
  pcVar7 = stringcache(pCVar1->strcache,"rsqrt");
  add_intrinsic_SAME1_ANYf(pCVar1,pcVar7);
  pcVar7 = stringcache(pCVar1->strcache,"saturate");
  add_intrinsic_SAME1_ANYf(pCVar1,pcVar7);
  pcVar7 = stringcache(pCVar1->strcache,"sign");
  add_intrinsic_SAME1_ANYf(pCVar1,pcVar7);
  pcVar7 = stringcache(pCVar1->strcache,"sin");
  add_intrinsic_SAME1_ANYf(pCVar1,pcVar7);
  pcVar7 = stringcache(pCVar1->strcache,"sincos");
  local_108 = local_c8;
  local_100 = local_c8;
  local_f8 = local_c8;
  pMVar9 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,3,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"double1",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  pMVar9 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar4 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,3,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar4,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"double2",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar9 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar9 = (local_108->array).base;
    }
  }
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar9;
  local_100 = pMVar9;
  local_f8 = pMVar9;
  pMVar9 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,3,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"double3",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  pMVar9 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar4 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,3,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar4,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"double4",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar9 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar9 = (local_108->array).base;
    }
  }
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar9;
  local_100 = pMVar9;
  local_f8 = pMVar9;
  pMVar9 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,3,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"double1x1",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  pMVar9 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar4 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,3,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar4,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"double1x2",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar9 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar9 = (local_108->array).base;
    }
  }
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar9;
  local_100 = pMVar9;
  local_f8 = pMVar9;
  pMVar9 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,3,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"double1x3",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  pMVar9 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar4 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,3,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar4,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"double1x4",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar9 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar9 = (local_108->array).base;
    }
  }
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar9;
  local_100 = pMVar9;
  local_f8 = pMVar9;
  pMVar9 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,3,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"double2x1",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  pMVar9 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar4 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,3,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar4,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"double2x2",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar9 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar9 = (local_108->array).base;
    }
  }
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar9;
  local_100 = pMVar9;
  local_f8 = pMVar9;
  pMVar9 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,3,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"double2x3",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  pMVar9 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar4 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,3,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar4,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"double2x4",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar9 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar9 = (local_108->array).base;
    }
  }
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar9;
  local_100 = pMVar9;
  local_f8 = pMVar9;
  pMVar9 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,3,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"double3x1",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  pMVar9 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar4 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,3,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar4,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"double3x2",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar9 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar9 = (local_108->array).base;
    }
  }
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar9;
  local_100 = pMVar9;
  local_f8 = pMVar9;
  pMVar9 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,3,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"double3x3",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  pMVar9 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar4 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,3,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar4,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"double3x4",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar9 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar9 = (local_108->array).base;
    }
  }
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar9;
  local_100 = pMVar9;
  local_f8 = pMVar9;
  pMVar9 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,3,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"double4x1",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  pMVar9 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar4 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,3,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar4,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"double4x2",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar9 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar9 = (local_108->array).base;
    }
  }
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar9;
  local_100 = pMVar9;
  local_f8 = pMVar9;
  pMVar9 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,3,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"double4x3",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  pMVar9 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar4 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,3,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar4,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"double4x4",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar9 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar9 = (local_108->array).base;
    }
  }
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar9;
  local_100 = pMVar9;
  local_f8 = pMVar9;
  pMVar9 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,3,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar9,0);
  local_108 = local_c0;
  local_100 = local_c0;
  local_f8 = local_c0;
  pMVar9 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,3,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"half1",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  pMVar9 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar4 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,3,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar4,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"half2",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar9 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar9 = (local_108->array).base;
    }
  }
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar9;
  local_100 = pMVar9;
  local_f8 = pMVar9;
  pMVar9 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,3,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"half3",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  pMVar9 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar4 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,3,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar4,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"half4",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar9 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar9 = (local_108->array).base;
    }
  }
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar9;
  local_100 = pMVar9;
  local_f8 = pMVar9;
  pMVar9 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,3,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"half1x1",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  pMVar9 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar4 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,3,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar4,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"half1x2",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar9 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar9 = (local_108->array).base;
    }
  }
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar9;
  local_100 = pMVar9;
  local_f8 = pMVar9;
  pMVar9 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,3,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"half1x3",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  pMVar9 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar4 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,3,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar4,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"half1x4",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar9 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar9 = (local_108->array).base;
    }
  }
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar9;
  local_100 = pMVar9;
  local_f8 = pMVar9;
  pMVar9 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,3,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"half2x1",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  pMVar9 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar4 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,3,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar4,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"half2x2",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar9 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar9 = (local_108->array).base;
    }
  }
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar9;
  local_100 = pMVar9;
  local_f8 = pMVar9;
  pMVar9 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,3,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"half2x3",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  pMVar9 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar4 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,3,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar4,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"half2x4",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar9 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar9 = (local_108->array).base;
    }
  }
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar9;
  local_100 = pMVar9;
  local_f8 = pMVar9;
  pMVar9 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,3,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"half3x1",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  pMVar9 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar4 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,3,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar4,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"half3x2",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar9 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar9 = (local_108->array).base;
    }
  }
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar9;
  local_100 = pMVar9;
  local_f8 = pMVar9;
  pMVar9 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,3,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"half3x3",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  pMVar9 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar4 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,3,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar4,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"half3x4",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar9 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar9 = (local_108->array).base;
    }
  }
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar9;
  local_100 = pMVar9;
  local_f8 = pMVar9;
  pMVar9 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,3,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"half4x1",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  pMVar9 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar4 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,3,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar4,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"half4x2",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar9 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar9 = (local_108->array).base;
    }
  }
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar9;
  local_100 = pMVar9;
  local_f8 = pMVar9;
  pMVar9 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,3,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"half4x3",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  pMVar9 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar4 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,3,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar4,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"half4x4",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar9 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar9 = (local_108->array).base;
    }
  }
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar9;
  local_100 = pMVar9;
  local_f8 = pMVar9;
  pMVar9 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,3,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar9,0);
  local_108 = pMVar8;
  local_100 = pMVar8;
  local_f8 = pMVar8;
  pMVar9 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,3,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"float1",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  pMVar9 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar4 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,3,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar4,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"float2",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar9 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar9 = (local_108->array).base;
    }
  }
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar9;
  local_100 = pMVar9;
  local_f8 = pMVar9;
  pMVar9 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,3,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"float3",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  pMVar9 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar4 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,3,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar4,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"float4",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar9 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar9 = (local_108->array).base;
    }
  }
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar9;
  local_100 = pMVar9;
  local_f8 = pMVar9;
  pMVar9 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,3,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"float1x1",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  pMVar9 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar4 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,3,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar4,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"float1x2",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar9 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar9 = (local_108->array).base;
    }
  }
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar9;
  local_100 = pMVar9;
  local_f8 = pMVar9;
  pMVar9 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,3,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"float1x3",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  pMVar9 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar4 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,3,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar4,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"float1x4",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar9 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar9 = (local_108->array).base;
    }
  }
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar9;
  local_100 = pMVar9;
  local_f8 = pMVar9;
  pMVar9 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,3,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"float2x1",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  pMVar9 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar4 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,3,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar4,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"float2x2",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar9 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar9 = (local_108->array).base;
    }
  }
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar9;
  local_100 = pMVar9;
  local_f8 = pMVar9;
  pMVar9 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,3,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"float2x3",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  pMVar9 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar4 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,3,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar4,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"float2x4",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar9 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar9 = (local_108->array).base;
    }
  }
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar9;
  local_100 = pMVar9;
  local_f8 = pMVar9;
  pMVar9 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,3,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"float3x1",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  pMVar9 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar4 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,3,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar4,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"float3x2",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar9 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar9 = (local_108->array).base;
    }
  }
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar9;
  local_100 = pMVar9;
  local_f8 = pMVar9;
  pMVar9 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,3,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"float3x3",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  pMVar9 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar4 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,3,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar4,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"float3x4",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar9 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar9 = (local_108->array).base;
    }
  }
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar9;
  local_100 = pMVar9;
  local_f8 = pMVar9;
  pMVar9 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,3,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"float4x1",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  pMVar9 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar4 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,3,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar4,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"float4x2",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar9 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar9 = (local_108->array).base;
    }
  }
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar9;
  local_100 = pMVar9;
  local_f8 = pMVar9;
  pMVar9 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,3,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar9,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"float4x3",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  pMVar9 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar4;
  local_100 = pMVar4;
  local_f8 = pMVar4;
  pMVar4 = build_function_datatype(pCVar1,(MOJOSHADER_astDataType *)0x0,3,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar4,0);
  iVar3 = hash_find((pCVar1->usertypes).hash,"float4x4",&local_108);
  pCVar1 = local_e0;
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar9 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar9 = (local_108->array).base;
    }
  }
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  local_108 = pMVar9;
  local_100 = pMVar9;
  local_f8 = pMVar9;
  pMVar9 = build_function_datatype(local_e0,(MOJOSHADER_astDataType *)0x0,3,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar9,0);
  pcVar7 = stringcache(pCVar1->strcache,"sinh");
  add_intrinsic_SAME1_ANYf(pCVar1,pcVar7);
  pcVar7 = stringcache(pCVar1->strcache,"smoothstep");
  add_intrinsic_SAME1_ANYf_SAME1_SAME1(pCVar1,pcVar7);
  pcVar7 = stringcache(pCVar1->strcache,"sqrt");
  add_intrinsic_SAME1_ANYf(pCVar1,pcVar7);
  pcVar7 = stringcache(pCVar1->strcache,"step");
  add_intrinsic_SAME1_ANYf_SAME1(pCVar1,pcVar7);
  pcVar7 = stringcache(pCVar1->strcache,"tan");
  add_intrinsic_SAME1_ANYf(pCVar1,pcVar7);
  pcVar7 = stringcache(pCVar1->strcache,"tanh");
  add_intrinsic_SAME1_ANYf(pCVar1,pcVar7);
  pcVar7 = stringcache(pCVar1->strcache,"tex1D");
  iVar3 = hash_find((pCVar1->usertypes).hash,"float4",&local_108);
  pCVar1 = local_e0;
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  local_108 = &local_e0->dt_sampler1d;
  local_100 = pMVar8;
  pMVar8 = build_function_datatype(local_e0,pMVar4,2,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  pcVar7 = stringcache(pCVar1->strcache,"tex2D");
  iVar3 = hash_find((pCVar1->usertypes).hash,"float4",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  iVar3 = hash_find((pCVar1->usertypes).hash,"float2",&local_108);
  if ((iVar3 == 0) || (local_108 == (MOJOSHADER_astDataType *)0x0)) {
    local_100 = (MOJOSHADER_astDataType *)0x0;
  }
  else {
    local_100 = (local_108->array).base;
  }
  local_108 = &pCVar1->dt_sampler2d;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,2,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  pcVar7 = stringcache(pCVar1->strcache,"tex3D");
  iVar3 = hash_find((pCVar1->usertypes).hash,"float4",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  iVar3 = hash_find((pCVar1->usertypes).hash,"float3",&local_108);
  if ((iVar3 == 0) || (local_108 == (MOJOSHADER_astDataType *)0x0)) {
    local_100 = (MOJOSHADER_astDataType *)0x0;
  }
  else {
    local_100 = (local_108->array).base;
  }
  local_108 = &pCVar1->dt_sampler3d;
  pMVar8 = build_function_datatype(pCVar1,pMVar4,2,&local_108,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(pCVar1,pcVar7,pMVar8,0);
  pcVar7 = stringcache(pCVar1->strcache,"texCUBE");
  iVar3 = hash_find((pCVar1->usertypes).hash,"float4",&local_108);
  if (iVar3 != 0) {
    if (local_108 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_108->array).base;
    }
  }
  iVar3 = hash_find((pCVar1->usertypes).hash,"float3",&local_108);
  if ((iVar3 == 0) || (local_108 == (MOJOSHADER_astDataType *)0x0)) {
    local_100 = (MOJOSHADER_astDataType *)0x0;
  }
  else {
    local_100 = (local_108->array).base;
  }
  local_108 = &pCVar1->dt_samplercube;
  pMVar4 = build_function_datatype(pCVar1,pMVar4,2,&local_108,1);
  push_function(pCVar1,pcVar7,pMVar4,0);
  pcVar7 = stringcache(pCVar1->strcache,"transpose");
  add_intrinsic_SAME1_Mfib(pCVar1,pcVar7);
  pcVar7 = stringcache(pCVar1->strcache,"trunc");
  add_intrinsic_SAME1_ANYf(pCVar1,pcVar7);
  pcVar7 = stringcache(pCVar1->strcache,"ddx");
  add_intrinsic_SAME1_ANYf(pCVar1,pcVar7);
  pcVar7 = stringcache(pCVar1->strcache,"ddy");
  add_intrinsic_SAME1_ANYf(pCVar1,pcVar7);
  pcVar7 = stringcache(pCVar1->strcache,"frexp");
  add_intrinsic_SAME1_ANYf_SAME1(pCVar1,pcVar7);
  pcVar7 = stringcache(pCVar1->strcache,"fwidth");
  add_intrinsic_SAME1_ANYf(pCVar1,pcVar7);
  pcVar7 = stringcache(pCVar1->strcache,"tex1D");
  add_intrinsic_4f_s1_f_f_f(pCVar1,pcVar7);
  pcVar7 = stringcache(pCVar1->strcache,"tex1Dbias");
  add_intrinsic_4f_s1_4f(pCVar1,pcVar7);
  pcVar7 = stringcache(pCVar1->strcache,"tex1Dgrad");
  add_intrinsic_4f_s1_f_f_f(pCVar1,pcVar7);
  pcVar7 = stringcache(pCVar1->strcache,"tex1Dproj");
  add_intrinsic_4f_s1_4f(pCVar1,pcVar7);
  pcVar7 = stringcache(pCVar1->strcache,"tex2D");
  add_intrinsic_4f_s2_2f_2f_2f(pCVar1,pcVar7);
  pcVar7 = stringcache(pCVar1->strcache,"tex2Dbias");
  add_intrinsic_4f_s2_4f(pCVar1,pcVar7);
  pcVar7 = stringcache(pCVar1->strcache,"tex2Dgrad");
  add_intrinsic_4f_s2_2f_2f_2f(pCVar1,pcVar7);
  pcVar7 = stringcache(pCVar1->strcache,"tex2Dproj");
  add_intrinsic_4f_s2_4f(pCVar1,pcVar7);
  pcVar7 = stringcache(pCVar1->strcache,"tex3D");
  add_intrinsic_4f_s3_3f_3f_3f(pCVar1,pcVar7);
  pcVar7 = stringcache(pCVar1->strcache,"tex3Dbias");
  add_intrinsic_4f_s3_4f(pCVar1,pcVar7);
  pcVar7 = stringcache(pCVar1->strcache,"tex3Dgrad");
  add_intrinsic_4f_s3_3f_3f_3f(pCVar1,pcVar7);
  pcVar7 = stringcache(pCVar1->strcache,"tex3Dproj");
  add_intrinsic_4f_s3_4f(pCVar1,pcVar7);
  pcVar7 = stringcache(pCVar1->strcache,"texCUBE");
  add_intrinsic_4f_sc_3f_3f_3f(pCVar1,pcVar7);
  pcVar7 = stringcache(pCVar1->strcache,"texCUBEbias");
  add_intrinsic_4f_sc_4f(pCVar1,pcVar7);
  pcVar7 = stringcache(pCVar1->strcache,"texCUBEgrad");
  add_intrinsic_4f_sc_3f_3f_3f(pCVar1,pcVar7);
  pcVar7 = stringcache(pCVar1->strcache,"texCUBEproj");
  add_intrinsic_4f_sc_4f(pCVar1,pcVar7);
  pcVar7 = stringcache(pCVar1->strcache,"tex1Dlod");
  add_intrinsic_4f_s1_4f(pCVar1,pcVar7);
  pcVar7 = stringcache(pCVar1->strcache,"tex2Dlod");
  add_intrinsic_4f_s2_4f(pCVar1,pcVar7);
  pcVar7 = stringcache(pCVar1->strcache,"tex3Dlod");
  add_intrinsic_4f_s3_4f(pCVar1,pcVar7);
  pcVar7 = stringcache(pCVar1->strcache,"texCUBElod");
  add_intrinsic_4f_sc_4f(pCVar1,pcVar7);
  return;
}

Assistant:

static void init_builtins(Context *ctx)
{
    // add in standard typedefs...
    const struct
    {
        const char *str;
        const MOJOSHADER_astDataType *datatype;
    } types[] = {
        { "bool", &ctx->dt_bool },
        { "int", &ctx->dt_int },
        { "uint", &ctx->dt_uint },
        { "half", &ctx->dt_half },
        { "float", &ctx->dt_float },
        { "double", &ctx->dt_double },
    };

    int i, j, k;
    for (i = 0; i < STATICARRAYLEN(types); i++)
    {
        char buf[32];
        int len;
        const MOJOSHADER_astDataType *dt;

        for (j = 1; j <= 4; j++)
        {
            // "float2"
            dt = new_datatype_vector(ctx, types[i].datatype, j);
            len = snprintf(buf, sizeof (buf), "%s%d", types[i].str, j);
            push_usertype(ctx, stringcache_len(ctx->strcache, buf, len), dt);
            for (k = 1; k <= 4; k++)
            {
                // "float2x2"
                dt = new_datatype_matrix(ctx, types[i].datatype, j, k);
                len = snprintf(buf, sizeof (buf), "%s%dx%d", types[i].str,j,k);
                push_usertype(ctx, stringcache_len(ctx->strcache,buf,len), dt);
            } // for
        } // for
    } // for

    // !!! FIXME: block these out by pixel/vertex/etc shader.
    // !!! FIXME: calculate actual shader model (or maybe just let bytecode verifier throw up?).
    const int shader_model = 3;
    if (shader_model >= 1)
    {
        add_intrinsic_SAME1_ANYfi(ctx, stringcache(ctx->strcache, "abs"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "acos"));
        add_intrinsic_BOOL_ANYfib(ctx, stringcache(ctx->strcache, "all"));
        add_intrinsic_BOOL_ANYfib(ctx, stringcache(ctx->strcache, "any"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "asin"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "atan"));
        add_intrinsic_SAME1_ANYf_SAME1(ctx, stringcache(ctx->strcache, "atan2"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "ceil"));
        add_intrinsic_SAME1_ANYfi_SAME1_SAME1(ctx, stringcache(ctx->strcache, "clamp"));
        add_intrinsic_VOID_ANYf(ctx, stringcache(ctx->strcache, "clip"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "cos"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "cosh"));
        add_intrinsic_3f_3f_3f(ctx, stringcache(ctx->strcache, "cross"));
        add_intrinsic_4i_4f(ctx, stringcache(ctx->strcache, "D3DCOLORtoUBYTE4"));
        add_intrinsic_f_Vf_SAME1(ctx, stringcache(ctx->strcache, "distance"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "degrees"));
        add_intrinsic_f_SQUAREMATRIXf(ctx, stringcache(ctx->strcache, "determinant"));
        add_intrinsic_fi_Vfi_SAME1(ctx, stringcache(ctx->strcache, "dot"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "exp"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "exp2"));
        add_intrinsic_SAME1_Vf_SAME1_SAME1(ctx, stringcache(ctx->strcache, "faceforward"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "floor"));
        add_intrinsic_SAME1_ANYf_SAME1(ctx, stringcache(ctx->strcache, "fmod"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "frac"));
        add_intrinsic_BOOL_ANYf(ctx, stringcache(ctx->strcache, "isfinite"));
        add_intrinsic_BOOL_ANYf(ctx, stringcache(ctx->strcache, "isinf"));
        add_intrinsic_BOOL_ANYf(ctx, stringcache(ctx->strcache, "isnan"));
        add_intrinsic_SAME1_ANYf_SAME1(ctx, stringcache(ctx->strcache, "ldexp"));
        add_intrinsic_f_Vf(ctx, stringcache(ctx->strcache, "length"));
        add_intrinsic_SAME1_ANYf_SAME1_SAME1(ctx, stringcache(ctx->strcache, "lerp"));
        add_intrinsic_4f_f_f_f(ctx, stringcache(ctx->strcache, "lit"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "log"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "log10"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "log2"));
        add_intrinsic_SAME1_ANYfi_SAME1(ctx, stringcache(ctx->strcache, "max"));
        add_intrinsic_SAME1_ANYfi_SAME1(ctx, stringcache(ctx->strcache, "min"));
        add_intrinsic_SAME1_ANYfi_SAME1(ctx, stringcache(ctx->strcache, "modf"));  // !!! FIXME: out var?
        add_intrinsic_mul(ctx, stringcache(ctx->strcache, "mul"));
        add_intrinsic_f_Vf(ctx, stringcache(ctx->strcache, "noise"));
        add_intrinsic_SAME1_Vf(ctx, stringcache(ctx->strcache, "normalize"));
        add_intrinsic_SAME1_ANYf_SAME1(ctx, stringcache(ctx->strcache, "pow"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "radians"));
        add_intrinsic_SAME1_ANYfi_SAME1(ctx, stringcache(ctx->strcache, "reflect"));
        add_intrinsic_SAME1_Vf_SAME1_f(ctx, stringcache(ctx->strcache, "refract"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "round"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "rsqrt"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "saturate"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "sign"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "sin"));
        add_intrinsic_VOID_ANYf_SAME1_SAME1(ctx, stringcache(ctx->strcache, "sincos"));  // !!! FIXME: out var?
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "sinh"));
        add_intrinsic_SAME1_ANYf_SAME1_SAME1(ctx, stringcache(ctx->strcache, "smoothstep"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "sqrt"));
        add_intrinsic_SAME1_ANYf_SAME1(ctx, stringcache(ctx->strcache, "step"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "tan"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "tanh"));
        add_intrinsic_4f_s1_f(ctx, stringcache(ctx->strcache, "tex1D"));
        add_intrinsic_4f_s2_2f(ctx, stringcache(ctx->strcache, "tex2D"));
        add_intrinsic_4f_s3_3f(ctx, stringcache(ctx->strcache, "tex3D"));
        add_intrinsic_4f_sc_3f(ctx, stringcache(ctx->strcache, "texCUBE"));
        add_intrinsic_SAME1_Mfib(ctx, stringcache(ctx->strcache, "transpose"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "trunc"));
    } // if

    if (shader_model >= 2)
    {
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "ddx"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "ddy"));
        add_intrinsic_SAME1_ANYf_SAME1(ctx, stringcache(ctx->strcache, "frexp"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "fwidth"));
        add_intrinsic_4f_s1_f_f_f(ctx, stringcache(ctx->strcache, "tex1D"));
        add_intrinsic_4f_s1_4f(ctx, stringcache(ctx->strcache, "tex1Dbias"));
        add_intrinsic_4f_s1_f_f_f(ctx, stringcache(ctx->strcache, "tex1Dgrad"));
        add_intrinsic_4f_s1_4f(ctx, stringcache(ctx->strcache, "tex1Dproj"));
        add_intrinsic_4f_s2_2f_2f_2f(ctx, stringcache(ctx->strcache, "tex2D"));
        add_intrinsic_4f_s2_4f(ctx, stringcache(ctx->strcache, "tex2Dbias"));
        add_intrinsic_4f_s2_2f_2f_2f(ctx, stringcache(ctx->strcache, "tex2Dgrad"));
        add_intrinsic_4f_s2_4f(ctx, stringcache(ctx->strcache, "tex2Dproj"));
        add_intrinsic_4f_s3_3f_3f_3f(ctx, stringcache(ctx->strcache, "tex3D"));
        add_intrinsic_4f_s3_4f(ctx, stringcache(ctx->strcache, "tex3Dbias"));
        add_intrinsic_4f_s3_3f_3f_3f(ctx, stringcache(ctx->strcache, "tex3Dgrad"));
        add_intrinsic_4f_s3_4f(ctx, stringcache(ctx->strcache, "tex3Dproj"));
        add_intrinsic_4f_sc_3f_3f_3f(ctx, stringcache(ctx->strcache, "texCUBE"));
        add_intrinsic_4f_sc_4f(ctx, stringcache(ctx->strcache, "texCUBEbias"));
        add_intrinsic_4f_sc_3f_3f_3f(ctx, stringcache(ctx->strcache, "texCUBEgrad"));
        add_intrinsic_4f_sc_4f(ctx, stringcache(ctx->strcache, "texCUBEproj"));
    } // if

    if (shader_model >= 3)
    {
        add_intrinsic_4f_s1_4f(ctx, stringcache(ctx->strcache, "tex1Dlod"));
        add_intrinsic_4f_s2_4f(ctx, stringcache(ctx->strcache, "tex2Dlod"));
        add_intrinsic_4f_s3_4f(ctx, stringcache(ctx->strcache, "tex3Dlod"));
        add_intrinsic_4f_sc_4f(ctx, stringcache(ctx->strcache, "texCUBElod"));
    } // if
}